

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcResub.c
# Opt level: O0

Dec_Graph_t * Abc_ManResubDivs2(Abc_ManRes_t *p,int Required)

{
  void *pvVar1;
  void *pvVar2;
  void *pvVar3;
  void *pvVar4;
  int iVar5;
  Abc_Obj_t *pAVar6;
  Abc_Obj_t *pAVar7;
  Abc_Obj_t *pAVar8;
  Abc_Obj_t *pAVar9;
  Dec_Graph_t *pDVar10;
  int local_64;
  int local_60;
  int w;
  int k;
  int i;
  uint *puDataR;
  uint *puData2;
  uint *puData1;
  uint *puData0;
  Abc_Obj_t *pObj2;
  Abc_Obj_t *pObj1;
  Abc_Obj_t *pObj0;
  int Required_local;
  Abc_ManRes_t *p_local;
  
  pvVar1 = (p->pRoot->field_5).pData;
  for (w = 0; iVar5 = Vec_PtrSize(p->vDivs1UP), w < iVar5; w = w + 1) {
    pAVar6 = (Abc_Obj_t *)Vec_PtrEntry(p->vDivs1UP,w);
    pAVar7 = Abc_ObjRegular(pAVar6);
    pvVar2 = (pAVar7->field_5).pData;
    for (local_60 = 0; iVar5 = Vec_PtrSize(p->vDivs2UP0), local_60 < iVar5; local_60 = local_60 + 1)
    {
      pAVar7 = (Abc_Obj_t *)Vec_PtrEntry(p->vDivs2UP0,local_60);
      pAVar8 = (Abc_Obj_t *)Vec_PtrEntry(p->vDivs2UP1,local_60);
      pAVar9 = Abc_ObjRegular(pAVar7);
      pvVar3 = (pAVar9->field_5).pData;
      pAVar9 = Abc_ObjRegular(pAVar8);
      pvVar4 = (pAVar9->field_5).pData;
      iVar5 = Abc_ObjIsComplement(pAVar6);
      if (iVar5 == 0) {
        iVar5 = Abc_ObjIsComplement(pAVar7);
        if ((iVar5 == 0) || (iVar5 = Abc_ObjIsComplement(pAVar8), iVar5 == 0)) {
          iVar5 = Abc_ObjIsComplement(pAVar7);
          if (iVar5 == 0) {
            iVar5 = Abc_ObjIsComplement(pAVar8);
            if (iVar5 == 0) {
              local_64 = 0;
              while ((local_64 < p->nWords &&
                     ((((*(uint *)((long)pvVar2 + (long)local_64 * 4) |
                        *(uint *)((long)pvVar3 + (long)local_64 * 4) &
                        *(uint *)((long)pvVar4 + (long)local_64 * 4)) ^
                       *(uint *)((long)pvVar1 + (long)local_64 * 4)) & p->pCareSet[local_64]) == 0))
                    ) {
                local_64 = local_64 + 1;
              }
            }
            else {
              local_64 = 0;
              while ((local_64 < p->nWords &&
                     ((((*(uint *)((long)pvVar2 + (long)local_64 * 4) |
                        *(uint *)((long)pvVar3 + (long)local_64 * 4) &
                        (*(uint *)((long)pvVar4 + (long)local_64 * 4) ^ 0xffffffff)) ^
                       *(uint *)((long)pvVar1 + (long)local_64 * 4)) & p->pCareSet[local_64]) == 0))
                    ) {
                local_64 = local_64 + 1;
              }
            }
          }
          else {
            local_64 = 0;
            while ((local_64 < p->nWords &&
                   ((((*(uint *)((long)pvVar2 + (long)local_64 * 4) |
                      (*(uint *)((long)pvVar3 + (long)local_64 * 4) ^ 0xffffffff) &
                      *(uint *)((long)pvVar4 + (long)local_64 * 4)) ^
                     *(uint *)((long)pvVar1 + (long)local_64 * 4)) & p->pCareSet[local_64]) == 0)))
            {
              local_64 = local_64 + 1;
            }
          }
        }
        else {
          local_64 = 0;
          while ((local_64 < p->nWords &&
                 ((((*(uint *)((long)pvVar2 + (long)local_64 * 4) |
                    *(uint *)((long)pvVar3 + (long)local_64 * 4) |
                    *(uint *)((long)pvVar4 + (long)local_64 * 4)) ^
                   *(uint *)((long)pvVar1 + (long)local_64 * 4)) & p->pCareSet[local_64]) == 0))) {
            local_64 = local_64 + 1;
          }
        }
      }
      else {
        iVar5 = Abc_ObjIsComplement(pAVar7);
        if ((iVar5 == 0) || (iVar5 = Abc_ObjIsComplement(pAVar8), iVar5 == 0)) {
          iVar5 = Abc_ObjIsComplement(pAVar7);
          if (iVar5 == 0) {
            iVar5 = Abc_ObjIsComplement(pAVar8);
            if (iVar5 == 0) {
              local_64 = 0;
              while ((local_64 < p->nWords &&
                     ((((*(uint *)((long)pvVar2 + (long)local_64 * 4) ^ 0xffffffff |
                        *(uint *)((long)pvVar3 + (long)local_64 * 4) &
                        *(uint *)((long)pvVar4 + (long)local_64 * 4)) ^
                       *(uint *)((long)pvVar1 + (long)local_64 * 4)) & p->pCareSet[local_64]) == 0))
                    ) {
                local_64 = local_64 + 1;
              }
            }
            else {
              local_64 = 0;
              while ((local_64 < p->nWords &&
                     ((((*(uint *)((long)pvVar2 + (long)local_64 * 4) ^ 0xffffffff |
                        *(uint *)((long)pvVar3 + (long)local_64 * 4) &
                        (*(uint *)((long)pvVar4 + (long)local_64 * 4) ^ 0xffffffff)) ^
                       *(uint *)((long)pvVar1 + (long)local_64 * 4)) & p->pCareSet[local_64]) == 0))
                    ) {
                local_64 = local_64 + 1;
              }
            }
          }
          else {
            local_64 = 0;
            while ((local_64 < p->nWords &&
                   ((((*(uint *)((long)pvVar2 + (long)local_64 * 4) ^ 0xffffffff |
                      (*(uint *)((long)pvVar3 + (long)local_64 * 4) ^ 0xffffffff) &
                      *(uint *)((long)pvVar4 + (long)local_64 * 4)) ^
                     *(uint *)((long)pvVar1 + (long)local_64 * 4)) & p->pCareSet[local_64]) == 0)))
            {
              local_64 = local_64 + 1;
            }
          }
        }
        else {
          local_64 = 0;
          while ((local_64 < p->nWords &&
                 ((((*(uint *)((long)pvVar2 + (long)local_64 * 4) ^ 0xffffffff |
                    *(uint *)((long)pvVar3 + (long)local_64 * 4) |
                    *(uint *)((long)pvVar4 + (long)local_64 * 4)) ^
                   *(uint *)((long)pvVar1 + (long)local_64 * 4)) & p->pCareSet[local_64]) == 0))) {
            local_64 = local_64 + 1;
          }
        }
      }
      if (local_64 == p->nWords) {
        p->nUsedNode2OrAnd = p->nUsedNode2OrAnd + 1;
        pDVar10 = Abc_ManResubQuit2(p->pRoot,pAVar6,pAVar7,pAVar8,1);
        return pDVar10;
      }
    }
  }
  w = 0;
  do {
    iVar5 = Vec_PtrSize(p->vDivs1UN);
    if (iVar5 <= w) {
      return (Dec_Graph_t *)0x0;
    }
    pAVar6 = (Abc_Obj_t *)Vec_PtrEntry(p->vDivs1UN,w);
    pAVar7 = Abc_ObjRegular(pAVar6);
    pvVar2 = (pAVar7->field_5).pData;
    for (local_60 = 0; iVar5 = Vec_PtrSize(p->vDivs2UN0), local_60 < iVar5; local_60 = local_60 + 1)
    {
      pAVar7 = (Abc_Obj_t *)Vec_PtrEntry(p->vDivs2UN0,local_60);
      pAVar8 = (Abc_Obj_t *)Vec_PtrEntry(p->vDivs2UN1,local_60);
      pAVar9 = Abc_ObjRegular(pAVar7);
      pvVar3 = (pAVar9->field_5).pData;
      pAVar9 = Abc_ObjRegular(pAVar8);
      pvVar4 = (pAVar9->field_5).pData;
      iVar5 = Abc_ObjIsComplement(pAVar6);
      if (iVar5 == 0) {
        iVar5 = Abc_ObjIsComplement(pAVar7);
        if ((iVar5 == 0) || (iVar5 = Abc_ObjIsComplement(pAVar8), iVar5 == 0)) {
          iVar5 = Abc_ObjIsComplement(pAVar7);
          if (iVar5 == 0) {
            iVar5 = Abc_ObjIsComplement(pAVar8);
            if (iVar5 == 0) {
              local_64 = 0;
              while ((local_64 < p->nWords &&
                     (((*(uint *)((long)pvVar2 + (long)local_64 * 4) &
                        *(uint *)((long)pvVar3 + (long)local_64 * 4) &
                        *(uint *)((long)pvVar4 + (long)local_64 * 4) ^
                       *(uint *)((long)pvVar1 + (long)local_64 * 4)) & p->pCareSet[local_64]) == 0))
                    ) {
                local_64 = local_64 + 1;
              }
            }
            else {
              local_64 = 0;
              while ((local_64 < p->nWords &&
                     (((*(uint *)((long)pvVar2 + (long)local_64 * 4) &
                        *(uint *)((long)pvVar3 + (long)local_64 * 4) &
                        (*(uint *)((long)pvVar4 + (long)local_64 * 4) ^ 0xffffffff) ^
                       *(uint *)((long)pvVar1 + (long)local_64 * 4)) & p->pCareSet[local_64]) == 0))
                    ) {
                local_64 = local_64 + 1;
              }
            }
          }
          else {
            local_64 = 0;
            while ((local_64 < p->nWords &&
                   (((*(uint *)((long)pvVar2 + (long)local_64 * 4) &
                      (*(uint *)((long)pvVar3 + (long)local_64 * 4) ^ 0xffffffff) &
                      *(uint *)((long)pvVar4 + (long)local_64 * 4) ^
                     *(uint *)((long)pvVar1 + (long)local_64 * 4)) & p->pCareSet[local_64]) == 0)))
            {
              local_64 = local_64 + 1;
            }
          }
        }
        else {
          local_64 = 0;
          while ((local_64 < p->nWords &&
                 (((*(uint *)((long)pvVar2 + (long)local_64 * 4) &
                    (*(uint *)((long)pvVar3 + (long)local_64 * 4) |
                    *(uint *)((long)pvVar4 + (long)local_64 * 4)) ^
                   *(uint *)((long)pvVar1 + (long)local_64 * 4)) & p->pCareSet[local_64]) == 0))) {
            local_64 = local_64 + 1;
          }
        }
      }
      else {
        iVar5 = Abc_ObjIsComplement(pAVar7);
        if ((iVar5 == 0) || (iVar5 = Abc_ObjIsComplement(pAVar8), iVar5 == 0)) {
          iVar5 = Abc_ObjIsComplement(pAVar7);
          if (iVar5 == 0) {
            iVar5 = Abc_ObjIsComplement(pAVar8);
            if (iVar5 == 0) {
              local_64 = 0;
              while ((local_64 < p->nWords &&
                     ((((*(uint *)((long)pvVar2 + (long)local_64 * 4) ^ 0xffffffff) &
                        *(uint *)((long)pvVar3 + (long)local_64 * 4) &
                        *(uint *)((long)pvVar4 + (long)local_64 * 4) ^
                       *(uint *)((long)pvVar1 + (long)local_64 * 4)) & p->pCareSet[local_64]) == 0))
                    ) {
                local_64 = local_64 + 1;
              }
            }
            else {
              local_64 = 0;
              while ((local_64 < p->nWords &&
                     ((((*(uint *)((long)pvVar2 + (long)local_64 * 4) ^ 0xffffffff) &
                        *(uint *)((long)pvVar3 + (long)local_64 * 4) &
                        (*(uint *)((long)pvVar4 + (long)local_64 * 4) ^ 0xffffffff) ^
                       *(uint *)((long)pvVar1 + (long)local_64 * 4)) & p->pCareSet[local_64]) == 0))
                    ) {
                local_64 = local_64 + 1;
              }
            }
          }
          else {
            local_64 = 0;
            while ((local_64 < p->nWords &&
                   ((((*(uint *)((long)pvVar2 + (long)local_64 * 4) ^ 0xffffffff) &
                      (*(uint *)((long)pvVar3 + (long)local_64 * 4) ^ 0xffffffff) &
                      *(uint *)((long)pvVar4 + (long)local_64 * 4) ^
                     *(uint *)((long)pvVar1 + (long)local_64 * 4)) & p->pCareSet[local_64]) == 0)))
            {
              local_64 = local_64 + 1;
            }
          }
        }
        else {
          local_64 = 0;
          while ((local_64 < p->nWords &&
                 ((((*(uint *)((long)pvVar2 + (long)local_64 * 4) ^ 0xffffffff) &
                    (*(uint *)((long)pvVar3 + (long)local_64 * 4) |
                    *(uint *)((long)pvVar4 + (long)local_64 * 4)) ^
                   *(uint *)((long)pvVar1 + (long)local_64 * 4)) & p->pCareSet[local_64]) == 0))) {
            local_64 = local_64 + 1;
          }
        }
      }
      if (local_64 == p->nWords) {
        p->nUsedNode2AndOr = p->nUsedNode2AndOr + 1;
        pDVar10 = Abc_ManResubQuit2(p->pRoot,pAVar6,pAVar7,pAVar8,0);
        return pDVar10;
      }
    }
    w = w + 1;
  } while( true );
}

Assistant:

Dec_Graph_t * Abc_ManResubDivs2( Abc_ManRes_t * p, int Required )
{
    Abc_Obj_t * pObj0, * pObj1, * pObj2;
    unsigned * puData0, * puData1, * puData2, * puDataR;
    int i, k, w;
    puDataR = (unsigned *)p->pRoot->pData;
    // check positive unate divisors
    Vec_PtrForEachEntry( Abc_Obj_t *, p->vDivs1UP, pObj0, i )
    {
        puData0 = (unsigned *)Abc_ObjRegular(pObj0)->pData;
        Vec_PtrForEachEntry( Abc_Obj_t *, p->vDivs2UP0, pObj1, k )
        {
            pObj2 = (Abc_Obj_t *)Vec_PtrEntry( p->vDivs2UP1, k );

            puData1 = (unsigned *)Abc_ObjRegular(pObj1)->pData;
            puData2 = (unsigned *)Abc_ObjRegular(pObj2)->pData;
            if ( Abc_ObjIsComplement(pObj0) )
            {
                if ( Abc_ObjIsComplement(pObj1) && Abc_ObjIsComplement(pObj2) )
                {
                    for ( w = 0; w < p->nWords; w++ )
    //                    if ( (puData0[w] | (puData1[w] | puData2[w])) != puDataR[w] )
                        if ( ((~puData0[w] | (puData1[w] | puData2[w])) ^ puDataR[w]) & p->pCareSet[w] ) // care set
                            break;
                }
                else if ( Abc_ObjIsComplement(pObj1) )
                {
                    for ( w = 0; w < p->nWords; w++ )
    //                    if ( (puData0[w] | (~puData1[w] & puData2[w])) != puDataR[w] )
                        if ( ((~puData0[w] | (~puData1[w] & puData2[w])) ^ puDataR[w]) & p->pCareSet[w] ) // care set
                            break;
                }
                else if ( Abc_ObjIsComplement(pObj2) )
                {
                    for ( w = 0; w < p->nWords; w++ )
    //                    if ( (puData0[w] | (puData1[w] & ~puData2[w])) != puDataR[w] )
                        if ( ((~puData0[w] | (puData1[w] & ~puData2[w])) ^ puDataR[w]) & p->pCareSet[w] ) // care set
                            break;
                }
                else 
                {
                    for ( w = 0; w < p->nWords; w++ )
    //                    if ( (puData0[w] | (puData1[w] & puData2[w])) != puDataR[w] )
                        if ( ((~puData0[w] | (puData1[w] & puData2[w])) ^ puDataR[w]) & p->pCareSet[w] ) // care set
                            break;
                }
            }
            else
            {
                if ( Abc_ObjIsComplement(pObj1) && Abc_ObjIsComplement(pObj2) )
                {
                    for ( w = 0; w < p->nWords; w++ )
    //                    if ( (puData0[w] | (puData1[w] | puData2[w])) != puDataR[w] )
                        if ( ((puData0[w] | (puData1[w] | puData2[w])) ^ puDataR[w]) & p->pCareSet[w] ) // care set
                            break;
                }
                else if ( Abc_ObjIsComplement(pObj1) )
                {
                    for ( w = 0; w < p->nWords; w++ )
    //                    if ( (puData0[w] | (~puData1[w] & puData2[w])) != puDataR[w] )
                        if ( ((puData0[w] | (~puData1[w] & puData2[w])) ^ puDataR[w]) & p->pCareSet[w] ) // care set
                            break;
                }
                else if ( Abc_ObjIsComplement(pObj2) )
                {
                    for ( w = 0; w < p->nWords; w++ )
    //                    if ( (puData0[w] | (puData1[w] & ~puData2[w])) != puDataR[w] )
                        if ( ((puData0[w] | (puData1[w] & ~puData2[w])) ^ puDataR[w]) & p->pCareSet[w] ) // care set
                            break;
                }
                else 
                {
                    for ( w = 0; w < p->nWords; w++ )
    //                    if ( (puData0[w] | (puData1[w] & puData2[w])) != puDataR[w] )
                        if ( ((puData0[w] | (puData1[w] & puData2[w])) ^ puDataR[w]) & p->pCareSet[w] ) // care set
                            break;
                }
            }
            if ( w == p->nWords )
            {
                p->nUsedNode2OrAnd++;
                return Abc_ManResubQuit2( p->pRoot, pObj0, pObj1, pObj2, 1 );
            }
        }
    }
    // check negative unate divisors
    Vec_PtrForEachEntry( Abc_Obj_t *, p->vDivs1UN, pObj0, i )
    {
        puData0 = (unsigned *)Abc_ObjRegular(pObj0)->pData;
        Vec_PtrForEachEntry( Abc_Obj_t *, p->vDivs2UN0, pObj1, k )
        {
            pObj2 = (Abc_Obj_t *)Vec_PtrEntry( p->vDivs2UN1, k );

            puData1 = (unsigned *)Abc_ObjRegular(pObj1)->pData;
            puData2 = (unsigned *)Abc_ObjRegular(pObj2)->pData;
            if ( Abc_ObjIsComplement(pObj0) )
            {
                if ( Abc_ObjIsComplement(pObj1) && Abc_ObjIsComplement(pObj2) )
                {
                    for ( w = 0; w < p->nWords; w++ )
    //                    if ( (puData0[w] & (puData1[w] | puData2[w])) != puDataR[w] )
                        if ( ((~puData0[w] & (puData1[w] | puData2[w])) ^ puDataR[w]) & p->pCareSet[w] ) // care set
                            break;
                }
                else if ( Abc_ObjIsComplement(pObj1) )
                {
                    for ( w = 0; w < p->nWords; w++ )
    //                    if ( (puData0[w] & (~puData1[w] & puData2[w])) != puDataR[w] )
                        if ( ((~puData0[w] & (~puData1[w] & puData2[w])) ^ puDataR[w]) & p->pCareSet[w] ) // care set
                            break;
                }
                else if ( Abc_ObjIsComplement(pObj2) )
                {
                    for ( w = 0; w < p->nWords; w++ )
    //                    if ( (puData0[w] & (puData1[w] & ~puData2[w])) != puDataR[w] )
                        if ( ((~puData0[w] & (puData1[w] & ~puData2[w])) ^ puDataR[w]) & p->pCareSet[w] ) // care set
                            break;
                }
                else 
                {
                    for ( w = 0; w < p->nWords; w++ )
    //                    if ( (puData0[w] & (puData1[w] & puData2[w])) != puDataR[w] )
                        if ( ((~puData0[w] & (puData1[w] & puData2[w])) ^ puDataR[w]) & p->pCareSet[w] ) // care set
                            break;
                }
            }
            else
            {
                if ( Abc_ObjIsComplement(pObj1) && Abc_ObjIsComplement(pObj2) )
                {
                    for ( w = 0; w < p->nWords; w++ )
    //                    if ( (puData0[w] & (puData1[w] | puData2[w])) != puDataR[w] )
                        if ( ((puData0[w] & (puData1[w] | puData2[w])) ^ puDataR[w]) & p->pCareSet[w] ) // care set
                            break;
                }
                else if ( Abc_ObjIsComplement(pObj1) )
                {
                    for ( w = 0; w < p->nWords; w++ )
    //                    if ( (puData0[w] & (~puData1[w] & puData2[w])) != puDataR[w] )
                        if ( ((puData0[w] & (~puData1[w] & puData2[w])) ^ puDataR[w]) & p->pCareSet[w] ) // care set
                            break;
                }
                else if ( Abc_ObjIsComplement(pObj2) )
                {
                    for ( w = 0; w < p->nWords; w++ )
    //                    if ( (puData0[w] & (puData1[w] & ~puData2[w])) != puDataR[w] )
                        if ( ((puData0[w] & (puData1[w] & ~puData2[w])) ^ puDataR[w]) & p->pCareSet[w] ) // care set
                            break;
                }
                else 
                {
                    for ( w = 0; w < p->nWords; w++ )
    //                    if ( (puData0[w] & (puData1[w] & puData2[w])) != puDataR[w] )
                        if ( ((puData0[w] & (puData1[w] & puData2[w])) ^ puDataR[w]) & p->pCareSet[w] ) // care set
                            break;
                }
            }
            if ( w == p->nWords )
            {
                p->nUsedNode2AndOr++;
                return Abc_ManResubQuit2( p->pRoot, pObj0, pObj1, pObj2, 0 );
            }
        }
    }
    return NULL;
}